

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_computeDivergence
               (MultiFab *divu,Array<const_MultiFab_*,_3> *umac,Geometry *geom,
               bool already_on_centroids,MultiFab *vel_eb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  FabType FVar8;
  int iVar9;
  FabFactory<amrex::FArrayBox> *pFVar10;
  MFItInfo *this;
  byte in_CL;
  long lVar11;
  CoordSys *in_RDX;
  FabArrayBase *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *bareaarr;
  Array4<const_amrex::EBCellFlag> *flagarr;
  Array4<const_double> *bnormarr;
  Array4<const_double> *vfracarr;
  Array4<const_double> *vel_eb_arr;
  Array4<double> *divuarr;
  GpuArray<double,_3U> dxinv;
  EBCellFlagFab *flagfab;
  bool in_stack_00000297;
  Geometry *in_stack_00000298;
  Box *bx;
  MFIter mfi;
  MFItInfo info;
  MultiCutFab *barea;
  MultiCutFab *bnorm;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  Real Ueb_dot_n;
  MFIter *in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  FabArray<amrex::FArrayBox> *this_00;
  MFItInfo *in_stack_fffffffffffff9a0;
  long *plVar12;
  MFItInfo *in_stack_fffffffffffff9b0;
  FabArrayBase *in_stack_fffffffffffff9b8;
  Array4<const_amrex::EBCellFlag> *this_01;
  MFIter *in_stack_fffffffffffff9c0;
  int local_618;
  int local_614;
  int in_stack_fffffffffffff9f0;
  int iVar13;
  int in_stack_fffffffffffff9f4;
  long local_5c8 [8];
  long *local_588;
  Box *in_stack_fffffffffffffab0;
  EBCellFlagFab *in_stack_fffffffffffffab8;
  long local_538 [8];
  long *local_4f8;
  long local_4f0 [8];
  long *local_4b0;
  long local_4a8 [8];
  long *local_468;
  undefined1 local_460 [96];
  EBCellFlagFab *local_400;
  undefined1 local_3f4 [136];
  MFItInfo local_36c;
  MultiCutFab *local_358;
  MultiCutFab *local_350;
  MultiFab *local_348;
  FabArray<amrex::EBCellFlagFab> *local_340;
  MultiArray4<double> local_338;
  byte local_321;
  CoordSys *local_320;
  FabArrayBase *local_310;
  FB *local_308;
  int local_300;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_2f8;
  int local_2ec;
  int iStack_2e8;
  int local_2e4;
  undefined8 local_2e0;
  int local_2d8;
  FBData<amrex::FArrayBox> *local_2d0;
  int local_2c4;
  int iStack_2c0;
  int local_2bc;
  EBCellFlagFab *local_2b8;
  double local_2b0;
  undefined1 *local_2a8;
  long *local_2a0;
  long *local_298;
  long *local_290;
  Array4<const_amrex::EBCellFlag> *local_288;
  long *local_280;
  FabArray<amrex::FArrayBox> *local_278;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  Array4<const_amrex::EBCellFlag> *local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  FabArray<amrex::FArrayBox> *local_238;
  int local_22c;
  int local_228;
  int local_224;
  long *local_220;
  int local_214;
  int local_210;
  int local_20c;
  long *local_208;
  undefined4 local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  long *local_1f0;
  undefined4 local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  long *local_1d8;
  undefined4 local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  long *local_1c0;
  undefined4 local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  long *local_1a8;
  undefined4 local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  long *local_190;
  undefined4 local_188;
  int local_184;
  int local_180;
  int local_17c;
  long *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  FBData<amrex::FArrayBox> *local_138;
  undefined4 local_12c;
  FBData<amrex::FArrayBox> *local_128;
  undefined4 local_11c;
  _Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_118;
  undefined4 local_10c;
  undefined1 *local_108;
  EBCellFlag *local_100;
  Dim3 local_f8;
  Dim3 local_e8;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  Box *local_b8;
  EBCellFlag *local_b0;
  Dim3 local_a8;
  Box *local_98;
  int local_90;
  int iStack_8c;
  int local_88;
  undefined4 local_84;
  Box *local_80;
  undefined4 local_74;
  Box *local_70;
  undefined4 local_64;
  Box *local_60;
  Dim3 local_58;
  Box *local_48;
  int local_40;
  int iStack_3c;
  int local_38;
  undefined4 local_34;
  IntVect *local_30;
  undefined4 local_24;
  IntVect *local_20;
  undefined4 local_14;
  IntVect *local_10;
  
  local_321 = in_CL & 1;
  local_320 = in_RDX;
  local_310 = in_RDI;
  EB_computeDivergence
            ((MultiFab *)
             mfi.m_fa._M_t.
             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
             _M_t.
             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
             (Array<const_MultiFab_*,_3> *)bx,in_stack_00000298,in_stack_00000297);
  pFVar10 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x13f4bf9);
  local_338.hp = (Array4<double> *)
                 __dynamic_cast(pFVar10,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
  if (local_338.hp != (Array4<double> *)0x0) {
    local_340 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    local_348 = EBFArrayBoxFactory::getVolFrac
                          ((EBFArrayBoxFactory *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    local_350 = EBFArrayBoxFactory::getBndryNormal
                          ((EBFArrayBoxFactory *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    local_358 = EBFArrayBoxFactory::getBndryArea
                          ((EBFArrayBoxFactory *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    MFItInfo::MFItInfo(in_stack_fffffffffffff9a0);
    this = MFItInfo::EnableTiling(&local_36c,(IntVect *)&FabArrayBase::mfiter_tile_size);
    MFItInfo::SetDynamic(this,true);
    MFIter::MFIter(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    while (bVar7 = MFIter::isValid((MFIter *)(local_3f4 + 0x24)), bVar7) {
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      local_3f4._28_8_ = local_3f4;
      local_400 = FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)
                             CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                             in_stack_fffffffffffff988);
      FVar8 = EBCellFlagFab::getType(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      if (FVar8 == singlevalued) {
        CoordSys::InvCellSizeArray((GpuArray<double,_3U> *)(local_460 + 0x48),local_320);
        this_00 = (FabArray<amrex::FArrayBox> *)local_460;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
        plVar12 = local_4a8;
        local_460._64_8_ = this_00;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
        local_468 = plVar12;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
        plVar12 = local_538;
        local_4b0 = local_4f0;
        MultiCutFab::const_array
                  ((MultiCutFab *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                   in_stack_fffffffffffff988);
        local_2b8 = local_400;
        local_b0 = (local_400->super_BaseFab<amrex::EBCellFlag>).dptr;
        local_b8 = &(local_400->super_BaseFab<amrex::EBCellFlag>).domain;
        local_bc = (local_400->super_BaseFab<amrex::EBCellFlag>).nvar;
        local_64 = 0;
        local_90 = (local_b8->smallend).vect[0];
        local_74 = 1;
        iStack_8c = (local_400->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
        local_d8.x = (local_b8->smallend).vect[0];
        local_d8.y = (local_b8->smallend).vect[1];
        local_84 = 2;
        local_d8.z = (local_400->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        local_10 = &(local_400->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
        local_14 = 0;
        local_40 = local_10->vect[0] + 1;
        local_20 = &(local_400->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
        local_24 = 1;
        iStack_3c = (local_400->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
        local_30 = &(local_400->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
        local_34 = 2;
        local_f8.z = (local_400->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
        local_f8.y = iStack_3c;
        local_f8.x = local_40;
        this_01 = (Array4<const_amrex::EBCellFlag> *)&stack0xfffffffffffffa80;
        local_4f8 = plVar12;
        local_e8._0_8_ = local_f8._0_8_;
        local_e8.z = local_f8.z;
        local_c8._0_8_ = local_d8._0_8_;
        local_c8.z = local_d8.z;
        local_a8._0_8_ = local_d8._0_8_;
        local_a8.z = local_d8.z;
        local_98 = local_b8;
        local_88 = local_d8.z;
        local_80 = local_b8;
        local_70 = local_b8;
        local_60 = local_b8;
        local_58._0_8_ = local_f8._0_8_;
        local_58.z = local_f8.z;
        local_48 = local_b8;
        local_38 = local_f8.z;
        Array4<const_amrex::EBCellFlag>::Array4(this_01,local_b0,&local_c8,&local_e8,local_bc);
        MultiCutFab::const_array
                  ((MultiCutFab *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                   in_stack_fffffffffffff988);
        local_2f8._M_t.
        super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
        .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
              )(__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
                )local_3f4._28_8_;
        local_118.super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
             (_Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>)
             (_Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>)local_3f4._28_8_;
        local_11c = 0;
        iVar1 = *(int *)(FB **)local_3f4._28_8_;
        local_128 = (FBData<amrex::FArrayBox> *)local_3f4._28_8_;
        local_12c = 1;
        iVar2 = *(int *)((long)(FB **)local_3f4._28_8_ + 4);
        local_308 = *(FB **)local_3f4._28_8_;
        local_138 = (FBData<amrex::FArrayBox> *)local_3f4._28_8_;
        local_13c = 2;
        iVar3 = *(int *)(local_3f4._28_8_ + 8);
        local_2d0 = (FBData<amrex::FArrayBox> *)local_3f4._28_8_;
        local_148 = (int *)(local_3f4._28_8_ + 0xc);
        local_14c = 0;
        iVar4 = *local_148;
        local_158 = (int *)(local_3f4._28_8_ + 0xc);
        local_15c = 1;
        iVar5 = *(int *)(local_3f4._28_8_ + 0x10);
        local_2e0 = *(undefined8 *)local_148;
        local_168 = (int *)(local_3f4._28_8_ + 0xc);
        local_16c = 2;
        iVar6 = *(int *)((long)(local_3f4._28_8_ + 0x10) + 4);
        in_stack_fffffffffffff994 = 0;
        local_588 = local_5c8;
        local_300 = iVar3;
        local_2ec = iVar1;
        iStack_2e8 = iVar2;
        local_2e4 = iVar3;
        local_2d8 = iVar6;
        local_2c4 = iVar4;
        iStack_2c0 = iVar5;
        local_2bc = iVar6;
        while (in_stack_fffffffffffff9f4 = in_stack_fffffffffffff994,
              iVar9 = FabArrayBase::nComp(local_310), iVar13 = iVar3,
              in_stack_fffffffffffff994 < iVar9) {
          for (; local_614 = iVar2, iVar13 <= iVar6; iVar13 = iVar13 + 1) {
            for (; local_618 = iVar1, local_614 <= iVar5; local_614 = local_614 + 1) {
              for (; local_618 <= iVar4; local_618 = local_618 + 1) {
                local_260 = local_618;
                local_264 = local_614;
                local_278 = (FabArray<amrex::FArrayBox> *)local_460._64_8_;
                local_280 = local_468;
                local_290 = local_4b0;
                local_298 = local_4f8;
                local_2a0 = local_588;
                local_2a8 = local_460 + 0x48;
                local_254 = local_618;
                local_258 = local_614;
                local_100 = this_01->p +
                            (long)(local_618 - (this_01->begin).x) +
                            (long)(local_614 - (this_01->begin).y) * this_01->jstride +
                            (long)(iVar13 - (this_01->begin).z) * this_01->kstride;
                if ((local_100->flag & 3) == 1) {
                  local_178 = local_468;
                  local_17c = local_618;
                  local_180 = local_614;
                  local_188 = 0;
                  local_190 = local_4f8;
                  local_194 = local_618;
                  local_198 = local_614;
                  local_1a0 = 0;
                  local_1a8 = local_468;
                  local_1ac = local_618;
                  local_1b0 = local_614;
                  local_1b8 = 1;
                  local_1c0 = local_4f8;
                  local_1c4 = local_618;
                  local_1c8 = local_614;
                  local_1d0 = 1;
                  local_1d8 = local_468;
                  local_1dc = local_618;
                  local_1e0 = local_614;
                  local_1e8 = 2;
                  local_1f0 = local_4f8;
                  local_1f4 = local_618;
                  local_1f8 = local_614;
                  local_200 = 2;
                  local_2b0 = *(double *)
                               (*local_468 +
                               ((long)(local_618 - (int)local_468[4]) +
                                (long)(local_614 - *(int *)((long)local_468 + 0x24)) * local_468[1]
                                + (long)(iVar13 - (int)local_468[5]) * local_468[2] +
                               local_468[3] * 2) * 8) *
                              *(double *)
                               (*local_4f8 +
                               ((long)(local_618 - (int)local_4f8[4]) +
                                (long)(local_614 - *(int *)((long)local_4f8 + 0x24)) * local_4f8[1]
                                + (long)(iVar13 - (int)local_4f8[5]) * local_4f8[2] +
                               local_4f8[3] * 2) * 8) +
                              *(double *)
                               (*local_468 +
                               ((long)(local_618 - (int)local_468[4]) +
                                (long)(local_614 - *(int *)((long)local_468 + 0x24)) * local_468[1]
                               + (long)(iVar13 - (int)local_468[5]) * local_468[2]) * 8) *
                              *(double *)
                               (*local_4f8 +
                               ((long)(local_618 - (int)local_4f8[4]) +
                                (long)(local_614 - *(int *)((long)local_4f8 + 0x24)) * local_4f8[1]
                               + (long)(iVar13 - (int)local_4f8[5]) * local_4f8[2]) * 8) +
                              *(double *)
                               (*local_468 +
                               ((long)(local_618 - (int)local_468[4]) +
                                (long)(local_614 - *(int *)((long)local_468 + 0x24)) * local_468[1]
                                + (long)(iVar13 - (int)local_468[5]) * local_468[2] + local_468[3])
                               * 8) * *(double *)
                                       (*local_4f8 +
                                       ((long)(local_618 - (int)local_4f8[4]) +
                                        (long)(local_614 - *(int *)((long)local_4f8 + 0x24)) *
                                        local_4f8[1] +
                                        (long)(iVar13 - (int)local_4f8[5]) * local_4f8[2] +
                                       local_4f8[3]) * 8);
                  local_208 = local_588;
                  local_20c = local_618;
                  local_210 = local_614;
                  local_10c = 0;
                  local_220 = local_4b0;
                  local_224 = local_618;
                  local_228 = local_614;
                  local_238 = (FabArray<amrex::FArrayBox> *)local_460._64_8_;
                  local_23c = local_618;
                  local_240 = local_614;
                  lVar11 = (long)(local_618 - *(int *)(local_460._64_8_ + 0x20)) +
                           (long)(local_614 - *(int *)(local_460._64_8_ + 0x24)) *
                           *(long *)&((BoxArray *)(local_460._64_8_ + 8))->m_bat +
                           (long)(iVar13 - *(int *)(local_460._64_8_ + 0x28)) *
                           *(long *)(local_460._64_8_ + 0x10) +
                           (long)in_stack_fffffffffffff9f4 * *(long *)(local_460._64_8_ + 0x18);
                  *(double *)(*(long *)local_460._64_8_ + lVar11 * 8) =
                       (local_2b0 *
                        *(double *)
                         (*local_588 +
                         ((long)(local_618 - (int)local_588[4]) +
                          (long)(local_614 - *(int *)((long)local_588 + 0x24)) * local_588[1] +
                         (long)(iVar13 - (int)local_588[5]) * local_588[2]) * 8) *
                       (double)local_460._72_8_) /
                       *(double *)
                        (*local_4b0 +
                        ((long)(local_618 - (int)local_4b0[4]) +
                         (long)(local_614 - *(int *)((long)local_4b0 + 0x24)) * local_4b0[1] +
                        (long)(iVar13 - (int)local_4b0[5]) * local_4b0[2]) * 8) +
                       *(double *)(*(long *)local_460._64_8_ + lVar11 * 8);
                  local_248 = in_stack_fffffffffffff9f4;
                  local_244 = iVar13;
                  local_22c = iVar13;
                  local_214 = iVar13;
                  local_1fc = iVar13;
                  local_1e4 = iVar13;
                  local_1cc = iVar13;
                  local_1b4 = iVar13;
                  local_19c = iVar13;
                  local_184 = iVar13;
                  local_108 = local_2a8;
                }
                local_288 = this_01;
                local_26c = in_stack_fffffffffffff9f4;
                local_268 = iVar13;
                local_25c = iVar13;
                local_250 = this_01;
              }
            }
          }
          in_stack_fffffffffffff994 = in_stack_fffffffffffff9f4 + 1;
          in_stack_fffffffffffff9f0 = iVar13;
        }
      }
      MFIter::operator++((MFIter *)(local_3f4 + 0x24));
    }
    MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void EB_computeDivergence (MultiFab& divu, const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                           const Geometry& geom, bool already_on_centroids,
                           const MultiFab& vel_eb)
{
    AMREX_ASSERT(divu.hasEBFabFactory());

    EB_computeDivergence(divu, umac, geom, already_on_centroids);

    // Add EB flow contribution
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(divu.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& vfrac = factory.getVolFrac();
    const auto& bnorm = factory.getBndryNormal();
    const auto& barea = factory.getBndryArea();

    MFItInfo info;
    if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(divu,info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        const auto& flagfab = flags[mfi];

        if (flagfab.getType(bx) == FabType::singlevalued) {
            const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

            Array4<Real> const& divuarr = divu.array(mfi);
            Array4<Real const> const& vel_eb_arr = vel_eb.const_array(mfi);
            Array4<Real const> const& vfracarr = vfrac.const_array(mfi);
            Array4<Real const> const& bnormarr = bnorm.const_array(mfi);
            Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
            Array4<Real const> const& bareaarr = barea.const_array(mfi);

            AMREX_HOST_DEVICE_FOR_4D(bx,divu.nComp(),i,j,k,n,
            {
                eb_add_divergence_from_flow(i,j,k,n,divuarr,vel_eb_arr,
                    flagarr,vfracarr,bnormarr,bareaarr,dxinv);
            });
        }
    }
}